

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::tab::cdf1(tab *this,float_t u1,vec3 *wi)

{
  float_t fVar1;
  vec2 local_44;
  float_t eval;
  float_t local_30;
  float_t bmax;
  float_t local_24;
  vec3 *pvStack_20;
  float_t bmin;
  vec3 *wi_local;
  tab *ptStack_10;
  float_t u1_local;
  tab *this_local;
  
  pvStack_20 = wi;
  wi_local._4_4_ = u1;
  ptStack_10 = this;
  vec2::vec2((vec2 *)&stack0xffffffffffffffd4,0.0,1.0);
  local_24 = cdf(this,(vec2 *)&stack0xffffffffffffffd4,pvStack_20);
  vec2::vec2((vec2 *)&stack0xffffffffffffffc8,1.0,1.0);
  local_30 = cdf(this,(vec2 *)&stack0xffffffffffffffc8,pvStack_20);
  vec2::vec2(&local_44,wi_local._4_4_,1.0);
  fVar1 = cdf(this,&local_44,pvStack_20);
  return (fVar1 - local_24) / (local_30 - local_24);
}

Assistant:

float_t tab::cdf1(float_t u1, const vec3 &wi) const
{
	float_t bmin = cdf(vec2( 0, 1), wi);
	float_t bmax = cdf(vec2( 1, 1), wi);
	float_t eval = cdf(vec2(u1, 1), wi);

	return (eval - bmin) / (bmax - bmin);
}